

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  int iVar1;
  size_t sVar2;
  ZSTD_literalCompressionMode_e lcm;
  int value_local;
  
  value_local = value;
  switch(param) {
  case ZSTD_c_compressionLevel:
    sVar2 = ZSTD_cParam_clampBounds(ZSTD_c_compressionLevel,&value_local);
    if (0xffffffffffffff88 < sVar2) {
      return sVar2;
    }
    if (value_local == 0) {
      value_local = CCtxParams->compressionLevel;
    }
    else {
      CCtxParams->compressionLevel = value_local;
    }
    if (value_local < 1) {
      return 0;
    }
    return (ulong)(uint)value_local;
  case ZSTD_c_windowLog:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).windowLog = value;
LAB_0010f8be:
      return (ulong)(uint)value;
    }
    break;
  case ZSTD_c_hashLog:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).hashLog = value;
      goto LAB_0010f8be;
    }
    break;
  case ZSTD_c_chainLog:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).chainLog = value;
      goto LAB_0010f8be;
    }
    break;
  case ZSTD_c_searchLog:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,value), iVar1 != 0)) {
      (CCtxParams->cParams).searchLog = value;
LAB_0010f6a2:
      return (long)value;
    }
    break;
  case ZSTD_c_minMatch:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,value), iVar1 != 0)) {
      (CCtxParams->cParams).minMatch = value;
      goto LAB_0010f8be;
    }
    break;
  case ZSTD_c_targetLength:
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,value);
    if (iVar1 != 0) {
      (CCtxParams->cParams).targetLength = value;
      goto LAB_0010f8be;
    }
    break;
  case ZSTD_c_strategy:
    if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,value), iVar1 != 0)) {
      (CCtxParams->cParams).strategy = value;
      goto LAB_0010f8be;
    }
    break;
  default:
    switch(param) {
    case ZSTD_c_enableLongDistanceMatching:
      (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_c_ldmHashLog:
      if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmHashLog,value), iVar1 != 0)) {
        (CCtxParams->ldmParams).hashLog = value;
        goto LAB_0010f8be;
      }
      break;
    case ZSTD_c_ldmMinMatch:
      if ((value == 0) || (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmMinMatch,value), iVar1 != 0))
      {
        (CCtxParams->ldmParams).minMatchLength = value;
        goto LAB_0010f8be;
      }
      break;
    case ZSTD_c_ldmBucketSizeLog:
      if ((value == 0) ||
         (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_ldmBucketSizeLog,value), iVar1 != 0)) {
        (CCtxParams->ldmParams).bucketSizeLog = value;
        goto LAB_0010f8be;
      }
      break;
    case ZSTD_c_ldmHashRateLog:
      if (value < 0x1a) {
        (CCtxParams->ldmParams).hashRateLog = value;
        goto LAB_0010f8be;
      }
      break;
    default:
      switch(param) {
      case ZSTD_c_experimentalParam3:
        CCtxParams->forceWindow = (uint)(value != 0);
        return (ulong)(value != 0);
      case ZSTD_c_experimentalParam4:
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam4,value);
        if (iVar1 != 0) {
          CCtxParams->attachDictPref = value;
          goto LAB_0010f8be;
        }
        break;
      case ZSTD_c_experimentalParam5:
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam5,value);
        if (iVar1 != 0) {
          CCtxParams->literalCompressionMode = value;
          goto LAB_0010f8be;
        }
        break;
      case ZSTD_c_experimentalParam6:
        if ((value == 0) ||
           (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam6,value), iVar1 != 0)) {
          CCtxParams->targetCBlockSize = (long)value;
          return (long)value;
        }
        break;
      case ZSTD_c_experimentalParam7:
        if ((value == 0) ||
           (iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam7,value), iVar1 != 0)) {
          CCtxParams->srcSizeHint = value;
          goto LAB_0010f6a2;
        }
        break;
      default:
        if (param == ZSTD_c_experimentalParam1) {
          sVar2 = ZSTD_cParam_clampBounds(ZSTD_c_overlapLog,&value_local);
          if (0xffffffffffffff88 < sVar2) {
            return sVar2;
          }
          CCtxParams->rsyncable = value_local;
          return (long)value_local;
        }
        if (param == ZSTD_c_contentSizeFlag) {
          (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
          return (ulong)(uint)(value != 0);
        }
        if (param == ZSTD_c_checksumFlag) {
          (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
          return (ulong)(value != 0);
        }
        if (param == ZSTD_c_dictIDFlag) {
          (CCtxParams->fParams).noDictIDFlag = (uint)(value == 0);
          return (ulong)(value != 0);
        }
        if (param == ZSTD_c_nbWorkers) {
          sVar2 = ZSTD_cParam_clampBounds(ZSTD_c_nbWorkers,&value_local);
          if (0xffffffffffffff88 < sVar2) {
            return sVar2;
          }
          CCtxParams->nbWorkers = value_local;
          return (long)value_local;
        }
        if (param == ZSTD_c_jobSize) {
          if (value < 0x100000 && value != 0) {
            value_local = 0x100000;
          }
          sVar2 = ZSTD_cParam_clampBounds(ZSTD_c_jobSize,&value_local);
          if (0xffffffffffffff88 < sVar2) {
            return sVar2;
          }
          sVar2 = (size_t)value_local;
          if (-1 < (long)sVar2) {
            CCtxParams->jobSize = sVar2;
            return sVar2;
          }
          __assert_fail("value >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2cce,
                        "size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params *, ZSTD_cParameter, int)"
                       );
        }
        if (param == ZSTD_c_overlapLog) {
          sVar2 = ZSTD_cParam_clampBounds(ZSTD_c_overlapLog,&value_local);
          if (0xffffffffffffff88 < sVar2) {
            return sVar2;
          }
          CCtxParams->overlapLog = value_local;
          return (long)value_local;
        }
        if (param != ZSTD_c_experimentalParam2) {
          return 0xffffffffffffffd8;
        }
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam2,value);
        if (iVar1 != 0) {
          CCtxParams->format = value;
          goto LAB_0010f8be;
        }
      }
    }
  }
  return 0xffffffffffffffd6;
}

Assistant:

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params* CCtxParams,
                                    ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParams_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        if (value) {  /* 0 : does not change current level */
            CCtxParams->compressionLevel = value;
        }
        if (CCtxParams->compressionLevel >= 0) return (size_t)CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = (U32)value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = (U32)value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = (U32)value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = (U32)value;
        return (size_t)value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_literalCompressionMode : {
        const ZSTD_literalCompressionMode_e lcm = (ZSTD_literalCompressionMode_e)value;
        BOUNDCHECK(ZSTD_c_literalCompressionMode, lcm);
        CCtxParams->literalCompressionMode = lcm;
        return CCtxParams->literalCompressionMode;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        CCtxParams->nbWorkers = value;
        return CCtxParams->nbWorkers;
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        /* Adjust to the minimum non-default value. */
        if (value != 0 && value < ZSTDMT_JOBSIZE_MIN)
            value = ZSTDMT_JOBSIZE_MIN;
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value));
        assert(value >= 0);
        CCtxParams->jobSize = value;
        return CCtxParams->jobSize;
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->overlapLog = value;
        return CCtxParams->overlapLog;
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value));
        CCtxParams->rsyncable = value;
        return CCtxParams->rsyncable;
#endif

    case ZSTD_c_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value!=0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        RETURN_ERROR_IF(value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN,
                        parameter_outOfBound);
        CCtxParams->ldmParams.hashRateLog = value;
        return CCtxParams->ldmParams.hashRateLog;

    case ZSTD_c_targetCBlockSize :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_targetCBlockSize, value);
        CCtxParams->targetCBlockSize = value;
        return CCtxParams->targetCBlockSize;

    case ZSTD_c_srcSizeHint :
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_srcSizeHint, value);
        CCtxParams->srcSizeHint = value;
        return CCtxParams->srcSizeHint;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
}